

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O1

bool renderKeyPresses(stStateUI *stateUI,TWaveform *waveform,TKeyPressCollection *keyPresses)

{
  pointer *ppsVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer psVar4;
  pointer psVar5;
  iterator __position;
  pointer psVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  uint __val;
  ImVec2 graph_size;
  ImVec2 graph_size_00;
  ImVec2 graph_size_01;
  ImVec2 graph_size_02;
  ImVec2 graph_size_03;
  float *pfVar9;
  float *pfVar10;
  uint uVar11;
  bool bVar12;
  ImU32 IVar13;
  int iVar14;
  uint uVar15;
  ImGuiIO *pIVar16;
  pointer psVar17;
  ImDrawList *pIVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ImVec2 *pIVar25;
  pointer __src;
  long lVar26;
  long lVar27;
  int *piVar28;
  uint __len;
  long lVar29;
  int *piVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar34;
  float fVar35;
  ImVec2 wsize;
  ImVec2 savePos;
  ImVec2 p2;
  ImVec2 p1;
  stWaveformView<short> tview;
  ImVec2 savePos2;
  stWaveformView<short> wview;
  bool local_141;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec4 local_128;
  float local_10c;
  undefined1 local_108 [8];
  int64_t iStack_100;
  long local_f8;
  TValueCC TStack_f0;
  undefined8 local_e8;
  TKey TStack_e0;
  undefined4 uStack_dc;
  int *local_d0;
  int *local_c8;
  ImVec2 *local_c0;
  float *local_b8;
  float *local_b0;
  undefined1 local_a8 [16];
  ImDrawList *local_98;
  ImVec2 local_90;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  ImVec2 local_68;
  long local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  long local_38;
  
  piVar30 = &stateUI->nview;
  piVar28 = &stateUI->offset;
  if (stateUI->nview < 0) {
    *piVar30 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 1);
  }
  if (*piVar28 < 0) {
    *piVar28 = (int)(((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 1) - (long)*piVar30
                    >> 1);
  }
  if ((stateUI->scrolling == false & stateUI->nview < 0x80000 & stateUI->recording) == 1) {
    iVar19 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 1);
    iVar14 = 0x80000;
    if (iVar19 < 0x80000) {
      iVar14 = iVar19;
    }
    *piVar30 = iVar14;
  }
  iVar14 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 1);
  if (stateUI->lastSize != iVar14) {
    stateUI->viewMax = iVar14;
    stateUI->lastSize = iVar14;
    stateUI->nviewPrev = stateUI->nview + 1;
    if (stateUI->scrolling == false) {
      *piVar28 = iVar14 - stateUI->nview;
    }
  }
  local_108 = (undefined1  [8])((ulong)(uint)stateUI->windowHeightTitleBar << 0x20);
  local_40.x = 0.0;
  local_40.y = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_108,2,&local_40);
  local_108._4_4_ = stateUI->windowHeightKeyPesses;
  if (((float)local_108._4_4_ != 0.0) || (NAN((float)local_108._4_4_))) {
    local_108._0_4_ = (float)g_windowSizeX;
  }
  else {
    local_108._4_4_ = 250.0;
    local_108._0_4_ = (float)g_windowSizeX;
  }
  ImGui::SetNextWindowSize((ImVec2 *)local_108,1);
  bVar12 = ImGui::Begin("Key Presses",(bool *)0x0,4);
  if (bVar12) {
    local_d0 = piVar30;
    local_c8 = piVar28;
    IVar7 = ImGui::GetContentRegionAvail();
    local_a8._8_4_ = extraout_XMM0_Dc;
    local_a8._0_4_ = IVar7.x;
    local_a8._4_4_ = IVar7.y;
    local_a8._12_4_ = extraout_XMM0_Dd;
    IVar7 = ImGui::GetContentRegionAvail();
    local_78 = IVar7.y;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fVar32 = ImGui::GetTextLineHeightWithSpacing();
    local_140.y = fVar32 * -3.0 + local_78;
    local_140.x = (float)local_a8._0_4_;
    if (stateUI->nview != stateUI->nviewPrev) {
      fVar32 = (float)stateUI->nview / (float)local_a8._0_4_;
      if (fVar32 <= 1.0) {
        fVar32 = 1.0;
      }
      local_108 = (undefined1  [8])
                  (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      iStack_100 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)local_108 >> 1;
      generateLowResWaveform<short>
                ((TWaveformViewT<short> *)local_108,&stateUI->waveformLowRes,(int)fVar32);
      stateUI->nviewPrev = stateUI->nview;
    }
    local_b0 = &stateUI->amin;
    local_b8 = &stateUI->amax;
    local_40 = (ImVec2)((stateUI->waveformLowRes).super__Vector_base<short,_std::allocator<short>_>.
                        _M_impl.super__Vector_impl_data._M_start + stateUI->offset);
    local_38 = (long)stateUI->nview;
    pIVar16 = ImGui::GetIO();
    local_a8._0_4_ = (pIVar16->MousePos).x;
    local_78 = (pIVar16->MousePos).y;
    local_138 = ImGui::GetCursorScreenPos();
    local_98 = ImGui::GetWindowDrawList();
    local_108._0_4_ = 0.3;
    local_108._4_4_ = 0.3;
    iStack_100 = 0x3e99999a3e99999a;
    ImGui::PushStyleColor(7,(ImVec4 *)local_108);
    local_108._0_4_ = 1.0;
    local_108._4_4_ = 1.0;
    iStack_100 = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)local_108);
    IVar7.y = local_140.y;
    IVar7.x = local_140.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveform,&local_40,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,IVar7);
    ImGui::PopStyleColor(2);
    ImGui::SetCursorScreenPos(&local_138);
    local_108._0_4_ = 0.1;
    local_108._4_4_ = 0.1;
    iStack_100 = 0x3dcccccd;
    ImGui::PushStyleColor(7,(ImVec4 *)local_108);
    local_108._0_4_ = 1.0;
    local_108._4_4_ = 1.0;
    iStack_100 = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)local_108);
    graph_size.y = local_140.y;
    graph_size.x = local_140.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveformInverse,&local_40,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,graph_size);
    ImGui::PopStyleColor(2);
    lVar20 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    psVar4 = (stateUI->waveformThreshold).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar30 = local_d0;
    if ((lVar20 == (long)(stateUI->waveformThreshold).
                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)psVar4) &&
       (psVar5 = (stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start,
       lVar20 == (long)(stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)psVar5)) {
      iStack_100 = (int64_t)*local_d0;
      local_108 = (undefined1  [8])(psVar4 + *local_c8);
      local_68 = (ImVec2)(psVar5 + *local_c8);
      local_60 = iStack_100;
      ImGui::SetCursorScreenPos(&local_138);
      local_128.x = 0.0;
      local_128.y = 0.0;
      local_128.z = 0.0;
      local_128.w = 0.0;
      ImGui::PushStyleColor(7,&local_128);
      local_128.x = 1.0;
      local_128.y = 1.0;
      local_128.z = 0.0;
      local_128.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_128);
      pfVar10 = local_b0;
      graph_size_00.y = local_140.y;
      graph_size_00.x = local_140.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveform,local_108,*local_d0,0,"",*local_b0,
                       *local_b8,graph_size_00);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_138);
      local_128.x = 0.0;
      local_128.y = 0.0;
      local_128.z = 0.0;
      local_128.w = 0.0;
      ImGui::PushStyleColor(7,&local_128);
      local_128.x = 1.0;
      local_128.y = 1.0;
      local_128.z = 0.0;
      local_128.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_128);
      pfVar9 = local_b8;
      graph_size_01.y = local_140.y;
      graph_size_01.x = local_140.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveformInverse,local_108,*local_d0,0,"",*pfVar10,
                       *local_b8,graph_size_01);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_138);
      local_128.x = 0.0;
      local_128.y = 0.0;
      local_128.z = 0.0;
      local_128.w = 0.0;
      ImGui::PushStyleColor(7,&local_128);
      local_128.x = 0.0;
      local_128.y = 1.0;
      local_128.z = 0.0;
      local_128.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_128);
      graph_size_02.y = local_140.y;
      graph_size_02.x = local_140.x;
      ImGui::PlotLines("##WaveformMax",plotWaveform,&local_68,*local_d0,0,"",*pfVar10,*pfVar9,
                       graph_size_02);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&local_138);
      local_128.x = 0.0;
      local_128.y = 0.0;
      local_128.z = 0.0;
      local_128.w = 0.0;
      ImGui::PushStyleColor(7,&local_128);
      local_128.x = 0.0;
      local_128.y = 1.0;
      local_128.z = 0.0;
      local_128.w = 0.5;
      ImGui::PushStyleColor(0x26,&local_128);
      piVar30 = local_d0;
      graph_size_03.y = local_140.y;
      graph_size_03.x = local_140.x;
      ImGui::PlotLines("##WaveformMax",plotWaveformInverse,&local_68,*local_d0,0,"",*pfVar10,*pfVar9
                       ,graph_size_03);
      ImGui::PopStyleColor(2);
    }
    ImGui::SetCursorScreenPos(&local_138);
    ImGui::InvisibleButton("##WaveformIB",&local_140);
    bVar12 = ImGui::IsItemHovered(0);
    local_141 = true;
    local_c0 = (ImVec2 *)waveform;
    if (bVar12) {
      pIVar16 = ImGui::GetIO();
      fVar32 = pIVar16->MouseWheel;
      iVar14 = stateUI->nview;
      iVar19 = (int)((float)iVar14 * ((fVar32 + 10.0) / 10.0));
      if (iVar19 < stateUI->viewMin) {
        iVar19 = stateUI->viewMin;
      }
      if (stateUI->viewMax < iVar19) {
        iVar19 = stateUI->viewMax;
      }
      stateUI->nview = iVar19;
      if ((fVar32 != 0.0) || (NAN(fVar32))) {
        fVar32 = (float)(iVar14 - iVar19) * (((float)local_a8._0_4_ - local_138.x) / local_140.x) +
                 (float)*local_c8;
        if (fVar32 <= 0.0) {
          fVar32 = 0.0;
        }
        *local_c8 = (int)fVar32;
      }
      bVar12 = ImGui::IsMouseDown(0);
      if ((bVar12) && (bVar12 = ImGui::IsMouseDragging(0,-1.0), !bVar12)) {
        stateUI->dragOffset = (float)stateUI->offset;
      }
      bVar12 = ImGui::IsMouseDragging(0,-1.0);
      if (bVar12) {
        local_10c = stateUI->dragOffset;
        IVar7 = ImGui::GetMouseDragDelta(0,-1.0);
        stateUI->offset = (int)(local_10c - ((float)stateUI->nview * IVar7.x) / local_140.x);
      }
      bVar12 = ImGui::IsMouseReleased(0);
      if (((bVar12) && (pIVar16 = ImGui::GetIO(), pIVar16->KeyCtrl != false)) ||
         (bVar12 = ImGui::IsMouseDoubleClicked(0), bVar12)) {
        lVar20 = (long)((((float)local_a8._0_4_ - local_138.x) * (float)*piVar30) / local_140.x +
                       (float)*local_c8);
        psVar17 = (keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(keyPresses->
                                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ).
                                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17) >> 4) *
            -0x55555555 < 1) {
          iVar14 = 0;
          local_141 = false;
        }
        else {
          lVar24 = 0;
          lVar29 = 0;
          local_141 = false;
          do {
            lVar23 = *(long *)((long)&psVar17->pos + lVar24);
            lVar21 = (stateUI->params).offsetFromPeak_samples + lVar23;
            lVar27 = (long)(stateUI->params).keyPressWidth_samples;
            lVar26 = lVar21 - lVar27;
            lVar21 = lVar21 + lVar27;
            lVar27 = lVar23;
            if (lVar26 < lVar23) {
              lVar27 = lVar26;
            }
            if (lVar21 < lVar27) {
              lVar27 = lVar21;
            }
            if (lVar20 < lVar27) {
              TStack_f0 = 0.0;
              local_e8._0_4_ = -1;
              local_e8._4_4_ = -1;
              TStack_e0 = 0x3f;
              local_108 = *(undefined1 (*) [8])local_c0;
              iStack_100 = (long)local_c0[1] - (long)local_108 >> 1;
              local_f8 = lVar20;
              std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::insert
                        (&keyPresses->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ,(stKeyPressData<short> *)((long)&(psVar17->waveform).samples + lVar24),
                         (value_type *)local_108);
              local_141 = true;
              bVar12 = false;
            }
            else {
              if (lVar26 < lVar23) {
                lVar26 = lVar23;
              }
              if (lVar26 <= lVar21) {
                lVar26 = lVar21;
              }
              bVar12 = lVar26 < lVar20;
            }
            if (!bVar12) break;
            lVar29 = lVar29 + 1;
            psVar17 = (keyPresses->
                      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar24 = lVar24 + 0x30;
          } while (lVar29 < (int)((ulong)((long)(keyPresses->
                                                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                ).
                                                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)psVar17) >> 4) * -0x55555555);
          iVar14 = (int)lVar29;
          waveform = (TWaveform *)local_c0;
        }
        piVar30 = local_d0;
        __position._M_current =
             (keyPresses->
             super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
             super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (!local_141 &&
            iVar14 == (int)((ulong)((long)__position._M_current -
                                   (long)(keyPresses->
                                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                         ).
                                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555) {
          TStack_f0 = 0.0;
          local_e8._0_4_ = -1;
          local_e8._4_4_ = -1;
          TStack_e0 = 0x3f;
          local_108 = *(undefined1 (*) [8])waveform;
          iStack_100 = (long)*(ImVec2 *)((long)waveform + 8) - (long)local_108 >> 1;
          if (__position._M_current ==
              (keyPresses->
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_f8 = lVar20;
            std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
            _M_realloc_insert<stKeyPressData<short>const&>
                      ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)
                       keyPresses,__position,(stKeyPressData<short> *)local_108);
          }
          else {
            (__position._M_current)->cid = -1;
            (__position._M_current)->bind = -1;
            *(ulong *)&(__position._M_current)->predicted = CONCAT44(uStack_dc,0x3f);
            (__position._M_current)->pos = lVar20;
            (__position._M_current)->ccAvg = 0.0;
            ((__position._M_current)->waveform).samples = (short *)local_108;
            ((__position._M_current)->waveform).n = iStack_100;
            ppsVar1 = &(keyPresses->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppsVar1 = *ppsVar1 + 1;
            local_f8 = lVar20;
          }
          local_141 = true;
        }
        local_141 = !local_141;
      }
    }
    bVar12 = ImGui::BeginPopupContextWindow((char *)0x0,1,true);
    if (bVar12) {
      ImGui::SliderInt("View  ",piVar30,stateUI->viewMin,stateUI->viewMax,"%d");
      ImGui::DragInt("Offset",local_c8,(float)stateUI->nview * 0.01,0,
                     (int)((ulong)((long)*(ImVec2 *)((long)waveform + 8) - (long)*(ImVec2 *)waveform
                                  ) >> 1) - stateUI->nview,"%d");
      ImGui::SliderFloat("Amplitude Min",local_b0,-32000.0,0.0,"%.3f",1.0);
      ImGui::SliderFloat("Amplitude Max",local_b8,0.0,32000.0,"%.3f",1.0);
      ImGui::EndPopup();
    }
    local_108._4_4_ = stateUI->scrollSize;
    local_108._0_4_ = local_140.x;
    ImGui::InvisibleButton("##WaveformScrollIB",(ImVec2 *)local_108);
    local_68.y = local_138.y + local_140.y;
    local_68.x = local_138.x;
    local_128.y = stateUI->scrollSize + local_138.y + local_140.y;
    local_128.x = local_140.x + local_138.x;
    local_108._0_4_ = 1.0;
    local_108._4_4_ = 1.0;
    iStack_100 = 0x3f8000003f800000;
    IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
    pIVar18 = local_98;
    ImDrawList::AddRect(local_98,&local_68,(ImVec2 *)&local_128,IVar13,0.0,0xf,1.0);
    uVar2 = stateUI->nview;
    uVar3 = stateUI->offset;
    fVar32 = local_140.y + local_138.y;
    local_68.y = fVar32;
    local_68.x = (local_140.x * (float)(int)uVar3) / (float)stateUI->viewMax + local_138.x;
    local_128.y = stateUI->scrollSize + fVar32;
    local_128.x = (((float)(int)uVar3 + (float)(int)uVar2) * local_140.x) / (float)stateUI->viewMax
                  + local_138.x;
    local_108._0_4_ = 1.0;
    local_108._4_4_ = 1.0;
    iStack_100 = 0x3f8000003f800000;
    IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
    ImDrawList::AddRectFilled(pIVar18,&local_68,(ImVec2 *)&local_128,IVar13,0.0,0xf);
    local_68 = ImGui::GetCursorScreenPos();
    bVar12 = ImGui::IsItemHovered(0);
    if ((bVar12) && (bVar12 = ImGui::IsMouseDown(0), bVar12)) {
      stateUI->scrolling = true;
    }
    if (stateUI->scrolling == true) {
      stateUI->offset =
           (int)((float)stateUI->viewMax * (((float)local_a8._0_4_ - local_138.x) / local_140.x) -
                (float)(stateUI->nview / 2));
    }
    bVar12 = ImGui::IsMouseDown(0);
    if (!bVar12) {
      stateUI->scrolling = false;
    }
    iVar14 = (int)((ulong)((long)local_c0[1] - (long)*local_c0) >> 1) - *local_d0;
    if (*local_c8 <= iVar14) {
      iVar14 = *local_c8;
    }
    iVar19 = 0;
    if (0 < iVar14) {
      iVar19 = iVar14;
    }
    *local_c8 = iVar19;
    psVar17 = (keyPresses->
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pIVar18 = local_98;
    if (0 < (int)((ulong)((long)(keyPresses->
                                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ).
                                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17) >> 4) *
            -0x55555555) {
      uVar31 = 0;
      piVar30 = local_d0;
      do {
        lVar20 = (long)(stateUI->params).offsetFromPeak_samples + psVar17[(int)uVar31].pos;
        lVar24 = (long)(stateUI->params).keyPressWidth_samples;
        iVar14 = stateUI->offset;
        if ((long)iVar14 <= lVar20 + lVar24) {
          if ((long)(*piVar30 + iVar14) <= lVar20 - lVar24) break;
          local_128.x = ((float)(psVar17[(int)uVar31].pos - (long)iVar14) / (float)*piVar30) *
                        local_140.x + local_138.x;
          local_128.y = local_138.y;
          local_130.y = local_138.y + local_140.y;
          local_130.x = local_128.x;
          local_108._0_4_ = 1.0;
          local_108._4_4_ = 0.0;
          iStack_100 = 0x3f4ccccd00000000;
          IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
          ImDrawList::AddLine(pIVar18,(ImVec2 *)&local_128,&local_130,IVar13,1.0);
          lVar20 = (keyPresses->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar31].pos;
          lVar29 = (long)stateUI->offset;
          lVar23 = (stateUI->params).offsetFromPeak_samples + lVar20;
          fVar32 = (float)stateUI->nview;
          lVar24 = (long)(stateUI->params).keyPressWidth_samples;
          fVar34 = (float)(lVar23 - (lVar24 + lVar29)) / fVar32;
          fVar35 = (float)((lVar24 - lVar29) + lVar23) / fVar32;
          fVar33 = ((float)(lVar20 - lVar29) / fVar32) * local_140.x + local_138.x;
          local_b8 = (float *)CONCAT44(local_b8._4_4_,fVar34);
          local_128.x = fVar34 * local_140.x + local_138.x;
          local_128.y = local_138.y;
          local_b0 = (float *)CONCAT44(local_b0._4_4_,fVar35);
          local_130.x = local_140.x * fVar35 + local_138.x;
          local_130.y = local_140.y + local_138.y;
          fVar32 = local_128.x;
          if (fVar33 <= local_128.x) {
            fVar32 = fVar33;
          }
          fVar34 = local_130.x;
          if (fVar32 <= local_130.x) {
            fVar34 = fVar32;
          }
          if ((float)local_a8._0_4_ <= fVar34) {
LAB_00136ac8:
            local_108._0_4_ = 1.0;
            local_108._4_4_ = 0.0;
            iStack_100 = 0x3e99999a00000000;
            IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
            ImDrawList::AddRectFilled(pIVar18,(ImVec2 *)&local_128,&local_130,IVar13,0.0,0xf);
          }
          else {
            fVar32 = local_128.x;
            if (local_128.x <= fVar33) {
              fVar32 = fVar33;
            }
            fVar33 = local_130.x;
            if (local_130.x <= fVar32) {
              fVar33 = fVar32;
            }
            if ((fVar33 <= (float)local_a8._0_4_) || (local_78 <= local_138.y)) goto LAB_00136ac8;
            local_108._0_4_ = 1.0;
            local_108._4_4_ = 0.0;
            iStack_100 = (ulong)*(uint *)(&DAT_0019f260 + (ulong)(local_78 < local_130.y) * 4) <<
                         0x20;
            local_10c = local_130.y;
            IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
            ImDrawList::AddRectFilled(pIVar18,(ImVec2 *)&local_128,&local_130,IVar13,0.0,0xf);
            if (local_78 < local_10c) {
              bVar12 = ImGui::IsMouseReleased(0);
              if ((!bVar12) ||
                 (pIVar16 = ImGui::GetIO(), bVar12 = local_141, pIVar16->KeyCtrl == false)) {
                bVar12 = ImGui::IsMouseDoubleClicked(0);
                bVar12 = (bool)(local_141 & bVar12);
              }
              if (bVar12 != false) {
                psVar17 = (keyPresses->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ).
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                psVar6 = (keyPresses->
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ).
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                __src = psVar17 + (long)(int)uVar31 + 1;
                if (__src != psVar6) {
                  memmove(psVar17 + (int)uVar31,__src,(long)psVar6 - (long)__src);
                }
                ppsVar1 = &(keyPresses->
                           super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                           ).
                           super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppsVar1 = *ppsVar1 + -1;
                uVar31 = uVar31 - 1;
              }
            }
          }
          if ((float)*piVar30 < local_140.x * 64.0) {
            local_10c = local_140.x;
            __val = -uVar31;
            if (0 < (int)uVar31) {
              __val = uVar31;
            }
            __len = 1;
            if (9 < __val) {
              uVar22 = (ulong)__val;
              uVar11 = 4;
              do {
                __len = uVar11;
                uVar15 = (uint)uVar22;
                if (uVar15 < 100) {
                  __len = __len - 2;
                  goto LAB_00136bc7;
                }
                if (uVar15 < 1000) {
                  __len = __len - 1;
                  goto LAB_00136bc7;
                }
                if (uVar15 < 10000) goto LAB_00136bc7;
                uVar22 = uVar22 / 10000;
                uVar11 = __len + 4;
              } while (99999 < uVar15);
              __len = __len + 1;
            }
LAB_00136bc7:
            local_7c = local_138.x;
            local_108 = (undefined1  [8])&local_f8;
            std::__cxx11::string::_M_construct
                      ((ulong)local_108,(char)__len - (char)((int)uVar31 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar31 >> 0x1f) + (long)local_108),__len,__val);
            IVar7 = ImGui::CalcTextSize((char *)local_108,(char *)0x0,false,-1.0);
            local_58._8_4_ = extraout_XMM0_Dc_00;
            local_58._0_4_ = IVar7.x;
            local_58._4_4_ = IVar7.y;
            local_58._12_4_ = extraout_XMM0_Dd_00;
            local_80 = local_138.y;
            local_84 = local_140.y;
            fVar32 = ImGui::GetTextLineHeightWithSpacing();
            local_90.y = (local_80 + local_84) - fVar32;
            local_90.x = ((local_b8._0_4_ + local_b0._0_4_) * local_10c - (float)local_58._0_4_) *
                         0.5 + local_7c;
            ImGui::SetCursorScreenPos(&local_90);
            pIVar18 = local_98;
            piVar30 = local_d0;
            if (local_108 != (undefined1  [8])&local_f8) {
              operator_delete((void *)local_108,local_f8 + 1);
            }
            ImGui::Text("%d",(ulong)uVar31);
          }
          local_128.x = ((float)((g_playbackData.idx + g_playbackData.offset) - (long)*local_c8) /
                        (float)*piVar30) * local_140.x + local_138.x;
          local_128.y = local_138.y;
          local_130.y = local_138.y + local_140.y;
          local_130.x = local_128.x;
          local_108._0_4_ = 1.0;
          local_108._4_4_ = 1.0;
          iStack_100 = 0x3e99999a00000000;
          IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
          ImDrawList::AddLine(pIVar18,(ImVec2 *)&local_128,&local_130,IVar13,1.0);
        }
        uVar31 = uVar31 + 1;
        psVar17 = (keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar14 = (int)((ulong)((long)(keyPresses->
                                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ).
                                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17) >>
                      4);
      } while (SBORROW4(uVar31,iVar14 * -0x55555555) != (int)(uVar31 + iVar14 * 0x55555555) < 0);
    }
    psVar17 = (keyPresses->
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(keyPresses->
                                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ).
                                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17) >> 4) *
            -0x55555555) {
      lVar20 = 0x10;
      lVar24 = 0;
      do {
        local_128.x = ((float)*(long *)((long)&(psVar17->waveform).samples + lVar20) /
                      (float)stateUI->viewMax) * local_140.x + local_138.x;
        local_128.y = local_138.y + local_140.y;
        local_130.y = local_138.y + local_140.y + stateUI->scrollSize;
        local_130.x = local_128.x;
        local_108._0_4_ = 1.0;
        local_108._4_4_ = 0.0;
        iStack_100 = 0x3e99999a00000000;
        IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
        ImDrawList::AddLine(pIVar18,(ImVec2 *)&local_128,&local_130,IVar13,1.0);
        lVar24 = lVar24 + 1;
        psVar17 = (keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x30;
      } while (lVar24 < (int)((ulong)((long)(keyPresses->
                                            super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                            ).
                                            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)psVar17) >> 4) * -0x55555555);
    }
    ImGui::SetCursorScreenPos(&local_68);
    ImGui::PushItemWidth(100.0);
    pIVar25 = local_c0;
    if (stateUI->recording == false) {
      if (stateUI->audioCapture == true) {
        local_108._0_4_ = 0.0;
        local_108._4_4_ = 0.0;
        bVar12 = ImGui::Button("   Record",(ImVec2 *)local_108);
        if ((bVar12) &&
           ((ulong)((long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>.
                         _M_impl.super__Vector_impl_data._M_start) < 0x57e400)) {
          AudioLogger::resume(&audioLogger);
          stateUI->recording = true;
          LOCK();
          g_doRecord._M_base._M_i = (__atomic_base<bool>)true;
          UNLOCK();
        }
        local_130 = ImGui::GetCursorScreenPos();
        local_128._0_8_ = local_130;
        IVar7 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
        local_130.x = IVar7.x * 0.9 + local_130.x;
        fVar32 = ImGui::GetFrameHeightWithSpacing();
        local_130.y = fVar32 * -0.56 + local_130.y;
        pIVar18 = ImGui::GetWindowDrawList();
        local_108._0_4_ = 1.0;
        local_108._4_4_ = 0.0;
        iStack_100 = 0x3f80000000000000;
        IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
        ImDrawList::AddCircleFilled(pIVar18,&local_130,6.0,IVar13,0xc);
        ImGui::SetCursorScreenPos((ImVec2 *)&local_128);
        ImGui::SameLine(0.0,-1.0);
      }
      ImGui::Checkbox("x0.5",&renderKeyPresses::playHalfSpeed);
      ImGui::SameLine(0.0,-1.0);
      piVar30 = local_d0;
      if (g_playbackData.playing == true) {
        local_108._0_4_ = 0.0;
        local_108._4_4_ = 0.0;
        bVar12 = ImGui::Button("Stop",(ImVec2 *)local_108);
        if ((bVar12) ||
           ((bVar12 = ImGui::IsKeyPressed(0x2c,true), bVar12 &&
            (pIVar16 = ImGui::GetIO(), pIVar16->KeyCtrl != false)))) {
          g_playbackData.playing = false;
          g_playbackData.idx = g_playbackData.waveform.n + -0x400;
        }
      }
      else {
        local_108._0_4_ = 0.0;
        local_108._4_4_ = 0.0;
        bVar12 = ImGui::Button("Play",(ImVec2 *)local_108);
        piVar28 = local_c8;
        if ((bVar12) ||
           ((bVar12 = ImGui::IsKeyPressed(0x2c,true), piVar28 = local_c8, bVar12 &&
            (pIVar16 = ImGui::GetIO(), pIVar16->KeyCtrl != false)))) {
          g_playbackData.playing = true;
          g_playbackData.slowDown = renderKeyPresses::playHalfSpeed + 1;
          g_playbackData.idx = 0;
          g_playbackData.offset = (int64_t)*piVar28;
          iVar14 = 160000;
          if (*piVar30 < 160000) {
            iVar14 = *piVar30;
          }
          g_playbackData.waveform.samples = (short *)(g_playbackData.offset * 2 + (long)*pIVar25);
          g_playbackData.waveform.n = (int64_t)iVar14;
          SDL_PauseAudioDevice(g_deviceIdOut,0);
        }
      }
      if (g_playbackData.waveform.n + -0x200 <= g_playbackData.idx) {
        g_playbackData.playing = false;
        SDL_ClearQueuedAudio(g_deviceIdOut);
        SDL_PauseAudioDevice(g_deviceIdOut,1);
      }
      ImGui::SameLine(0.0,-1.0);
      bVar12 = ImGui::SliderFloat("Threshold background",&renderKeyPresses::thresholdBackground,0.1,
                                  50.0,"%.3f",1.0);
      if (bVar12) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar12 = ImGui::SliderInt("History Size",&renderKeyPresses::historySizeReset,0x200,0x4000,"%d"
                               );
      if (bVar12) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      local_108._0_4_ = 0.0;
      local_108._4_4_ = 0.0;
      bVar12 = ImGui::Button("Recalculate",(ImVec2 *)local_108);
      if (bVar12) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Key width",&(stateUI->params).keyPressWidth_samples,8.0,0,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Peak offset",&(stateUI->params).offsetFromPeak_samples,8.0,-0x640,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Align window",&(stateUI->params).alignWindow_samples,8.0,0,0x640,"%d");
      ImGui::PopItemWidth();
    }
    else {
      if (((byte)g_doRecord._M_base._M_i & 1) != 0) {
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        AudioLogger::record(&audioLogger,0.2,0);
      }
      local_108._0_4_ = 0.0;
      local_108._4_4_ = 0.0;
      bVar12 = ImGui::Button("   Stop Recording",(ImVec2 *)local_108);
      if (bVar12) {
        AudioLogger::pause(&audioLogger);
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        stateUI->recalculateKeyPresses = true;
        stateUI->lastSize = stateUI->lastSize + -1;
        stateUI->recording = false;
        stateUI->findBestCutoffFreq = true;
        stateUI->rescaleWaveform = true;
      }
      local_130 = ImGui::GetCursorScreenPos();
      local_128._0_8_ = local_130;
      IVar7 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
      local_130.x = IVar7.x * 0.9 + local_130.x;
      fVar32 = ImGui::GetFrameHeightWithSpacing();
      local_130.y = fVar32 * -0.56 + local_130.y;
      IVar8.y = local_130.y + -4.0;
      IVar8.x = local_130.x + -4.0;
      local_90.y = local_130.y + 4.0;
      local_90.x = local_130.x + 4.0;
      local_130 = IVar8;
      pIVar18 = ImGui::GetWindowDrawList();
      local_108._0_4_ = 1.0;
      local_108._4_4_ = 1.0;
      iStack_100 = 0x3f8000003f800000;
      IVar13 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_108);
      ImDrawList::AddRectFilled(pIVar18,&local_130,&local_90,IVar13,0.0,0xf);
      ImGui::SetCursorScreenPos((ImVec2 *)&local_128);
      ImGui::SameLine(0.0,-1.0);
      pIVar25 = local_c0;
      ImGui::Text("Record length: %4.2f s (max : %4.2f s)",
                  SUB84((double)((float)(ulong)((long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 1) /
                                16000.0),0),0);
    }
    if (stateUI->recalculateKeyPresses == true) {
      local_108 = *(undefined1 (*) [8])pIVar25;
      iStack_100 = (long)pIVar25[1] - (long)local_108 >> 1;
      findKeyPresses<short>
                ((TWaveformViewT<short> *)local_108,keyPresses,&stateUI->waveformThreshold,
                 &stateUI->waveformMax,(double)renderKeyPresses::thresholdBackground,0x200,
                 renderKeyPresses::historySizeReset,true);
      stateUI->recalculateKeyPresses = false;
    }
    fVar32 = ImGui::GetWindowHeight();
  }
  else {
    fVar32 = ImGui::GetTextLineHeightWithSpacing();
  }
  stateUI->windowHeightKeyPesses = fVar32;
  ImGui::End();
  return false;
}

Assistant:

bool renderKeyPresses(stStateUI & stateUI, const TWaveform & waveform, TKeyPressCollection & keyPresses) {
    auto & params = stateUI.params;

    bool & scrolling = stateUI.scrolling;
    bool & recalculateKeyPresses = stateUI.recalculateKeyPresses;

    int & nview = stateUI.nview;
    int & viewMin = stateUI.viewMin;
    int & viewMax = stateUI.viewMax;
    int & offset = stateUI.offset;
    int & lastSize = stateUI.lastSize;
    int & lastKeyPresses = stateUI.lastKeyPresses;

    float & amin = stateUI.amin;
    float & amax = stateUI.amax;

    float & dragOffset = stateUI.dragOffset;
    float & scrollSize = stateUI.scrollSize;

    auto & nviewPrev = stateUI.nviewPrev;

    TWaveform & waveformLowRes = stateUI.waveformLowRes;
    TWaveform & waveformThreshold = stateUI.waveformThreshold;
    TWaveform & waveformMax = stateUI.waveformMax;

    if (nview < 0) nview = waveform.size();
    if (offset < 0) offset = (waveform.size() - nview)/2;

    if (stateUI.recording) {
        if (nview < 1024*kSamplesPerFrame && scrolling == false) {
            nview = std::min((int) (1024*kSamplesPerFrame), (int) waveform.size());
        }
    }

    if (lastSize != (int) waveform.size()) {
        viewMax = waveform.size();
        lastSize = waveform.size();
        nviewPrev = nview + 1;

        if (scrolling == false) {
            offset = waveform.size() - nview;
        }
    }

#if 0
    if ((int) keyPresses.size() >= lastKeyPresses + 10) {
        lastKeyPresses = keyPresses.size();

        stateUI.similarityMap.clear();
        stateUI.flags.recalculateSimilarityMap = true;
        stateUI.doUpdate = true;
    }
#endif

    ImGui::SetNextWindowPos(ImVec2(0, stateUI.windowHeightTitleBar), ImGuiCond_Once);
    if (stateUI.windowHeightKeyPesses == 0.0f) {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, 250.0f), ImGuiCond_Always);
    } else {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, stateUI.windowHeightKeyPesses), ImGuiCond_Always);
    }
    if (ImGui::Begin("Key Presses", nullptr, ImGuiWindowFlags_NoMove)) {
        bool ignoreDelete = false;

        auto wsize = ImVec2(ImGui::GetContentRegionAvailWidth(), ImGui::GetContentRegionAvail().y - 3*ImGui::GetTextLineHeightWithSpacing());

        if (nview != nviewPrev) {
            generateLowResWaveform(waveform, waveformLowRes, std::max(1.0f, nview/wsize.x));
            nviewPrev = nview;
        }

        auto wview = getView(waveformLowRes, offset, nview);

        auto mpos = ImGui::GetIO().MousePos;
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.3f, 0.3f, 0.3f, 0.3f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveform, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);
        ImGui::SetCursorScreenPos(savePos);
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.1f, 0.1f, 0.1f, 0.0f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveformInverse, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);

        if (waveform.size() == waveformThreshold.size() && waveform.size() == waveformMax.size()) {
            auto tview = getView(waveformThreshold, offset, nview);
            auto mview = getView(waveformMax, offset, nview);

            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveform, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveformInverse, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveform, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveformInverse, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
        }
        ImGui::SetCursorScreenPos(savePos);

        ImGui::InvisibleButton("##WaveformIB",wsize);
        if (ImGui::IsItemHovered()) {
            auto w = ImGui::GetIO().MouseWheel;
            auto nview_old = nview;
            nview *= (10.0 + w)/10.0;
            nview = std::min(std::max(viewMin, nview), viewMax);
            if (w != 0.0) {
                offset = std::max(0.0f, offset + ((mpos.x - savePos.x)/wsize.x)*(nview_old - nview));
            }

            if (ImGui::IsMouseDown(0) && ImGui::IsMouseDragging(0) == false) {
                dragOffset = offset;
            }

            if (ImGui::IsMouseDragging(0)) {
                offset = dragOffset - ImGui::GetMouseDragDelta(0).x*nview/wsize.x;
            }

            if ((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) {
                int i = 0;
                int64_t pos = offset + nview*(mpos.x - savePos.x)/wsize.x;
                for (i = 0; i < (int) keyPresses.size(); ++i) {
                    int64_t p0 = keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples;
                    int64_t p1 = keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples;
                    int64_t pmin = std::min(std::min(keyPresses[i].pos, p0), p1);
                    int64_t pmax = std::max(std::max(keyPresses[i].pos, p0), p1);
                    if (pmin > pos) {
                        ignoreDelete = true;
                        TKeyPressData entry;
                        entry.pos = pos;
                        entry.waveform = getView(waveform, 0);
                        keyPresses.insert(keyPresses.begin() + i, entry);
                        break;
                    }
                    if (pos >= pmin && pos <= pmax) break;
                }
                if (i == (int) keyPresses.size() && ignoreDelete == false) {
                    ignoreDelete = true;
                    TKeyPressData entry;
                    entry.pos = pos;
                    entry.waveform = getView(waveform, 0);
                    keyPresses.push_back(entry);
                }
            }
        }
        if (ImGui::BeginPopupContextWindow()) {
            ImGui::SliderInt("View  ", &nview, viewMin, viewMax);
            ImGui::DragInt  ("Offset", &offset, 0.01*nview, 0, waveform.size() - nview);
            ImGui::SliderFloat("Amplitude Min", &amin, -32000, 0);
            ImGui::SliderFloat("Amplitude Max", &amax, 0, 32000);
            ImGui::EndPopup();
        }

        ImGui::InvisibleButton("##WaveformScrollIB", {wsize.x, scrollSize});
        drawList->AddRect({savePos.x, savePos.y + wsize.y}, {savePos.x + wsize.x, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));
        drawList->AddRectFilled({savePos.x + wsize.x*(1.f*offset)/viewMax, savePos.y + wsize.y}, {savePos.x + wsize.x*(1.f*offset + nview)/viewMax, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));

        auto savePos2 = ImGui::GetCursorScreenPos();

        if (ImGui::IsItemHovered()) {
            if (ImGui::IsMouseDown(0)) {
                scrolling = true;
            }
        }

        if (scrolling) {
            offset = ((mpos.x - savePos.x)/wsize.x)*viewMax - nview/2;
        }

        if (ImGui::IsMouseDown(0) == false) {
            scrolling = false;
        }

        offset = std::max(0, std::min((int) offset, (int) waveform.size() - nview));
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            if (keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples < offset) continue;
            if (keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples >= offset + nview) break;

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.8f }), 1.0f);
            }

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;
                float x1 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples - offset))/nview;
                float x2 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x1*wsize.x, savePos.y };
                ImVec2 p2 = { savePos.x + x2*wsize.x, savePos.y + wsize.y };

                float xmin = std::min(std::min(p0.x, p1.x), p2.x);
                float xmax = std::max(std::max(p0.x, p1.x), p2.x);

                bool isHovered = (mpos.x > xmin && mpos.x < xmax && mpos.y > p1.y && mpos.y < p2.y);

                float col = isHovered ? 0.7f : 0.3f;
                drawList->AddRectFilled(p1, p2, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, col }));

                if (isHovered) {
                    if (((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) && ignoreDelete == false) {
                        keyPresses.erase(keyPresses.begin() + i);
                        --i;
                    }
                }

                if (nview < 64.0*wsize.x) {
                    ImGui::SetCursorScreenPos({ savePos.x + 0.5f*((x1 + x2)*wsize.x - ImGui::CalcTextSize(std::to_string(i).c_str()).x), savePos.y + wsize.y - ImGui::GetTextLineHeightWithSpacing() });
                    ImGui::Text("%d", i);
                }

            }

            {
                float x0 = ((float)(g_playbackData.offset + g_playbackData.idx - offset))/nview;

                ImVec2 p0 = {savePos.x + x0*wsize.x, savePos.y};
                ImVec2 p1 = {savePos.x + x0*wsize.x, savePos.y + wsize.y};
                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 0.0f, 0.3f }));
            }
        }
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            {
                float x0 = ((float)(keyPresses[i].pos))/viewMax;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y + scrollSize };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.3f }));
            }
        }

        ImGui::SetCursorScreenPos(savePos2);

        //auto io = ImGui::GetIO();
        //ImGui::Text("Keys pressed:");   for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); i++) if (ImGui::IsKeyPressed(i))             { ImGui::SameLine(); ImGui::Text("%d", i); }

        static bool playHalfSpeed = false;
        static int historySizeReset = kFindKeysHistorySizeReset;
        static float thresholdBackground = kFindKeysThreshold;
        ImGui::PushItemWidth(100.0);

        if (stateUI.recording == false) {
            if (stateUI.audioCapture) {
                if (ImGui::Button("   Record")) {
                    if (float(stateUI.waveformInput.size()/kSampleRate) < kMaxRecordSize_s) {
                        audioLogger.resume();
                        stateUI.recording = true;
                        g_doRecord = true;
                    }
                }
                {
                    auto savePos = ImGui::GetCursorScreenPos();
                    auto p = savePos;
                    p.x += 0.90f*ImGui::CalcTextSize("  ").x;
                    p.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();
                    ImGui::GetWindowDrawList()->AddCircleFilled(p, 6.0, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 1.0f }));
                    ImGui::SetCursorScreenPos(savePos);
                }

                ImGui::SameLine();
            }

            ImGui::Checkbox("x0.5", &playHalfSpeed);
            ImGui::SameLine();
            if (g_playbackData.playing) {
                if (ImGui::Button("Stop") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = false;
                    g_playbackData.idx = g_playbackData.waveform.n - TPlaybackData::kSamples;
                }
            } else {
                if (ImGui::Button("Play") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = true;
                    g_playbackData.slowDown = playHalfSpeed ? 2 : 1;
                    g_playbackData.idx = 0;
                    g_playbackData.offset = offset;
                    g_playbackData.waveform = getView(waveform, offset, std::min((int) (10*kSampleRate), nview));
                    SDL_PauseAudioDevice(g_deviceIdOut, 0);
                }
            }

            if (g_playbackData.idx >= g_playbackData.waveform.n - kSamplesPerFrame) {
                g_playbackData.playing = false;
                SDL_ClearQueuedAudio(g_deviceIdOut);
#ifndef __EMSCRIPTEN__
                SDL_PauseAudioDevice(g_deviceIdOut, 1);
#endif
            }

            ImGui::SameLine();
            ImGui::SliderFloat("Threshold background", &thresholdBackground, 0.1f, 50.0f) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            ImGui::SliderInt("History Size", &historySizeReset, 512, 1024*16) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            if (ImGui::Button("Recalculate")) {
                recalculateKeyPresses = true;
            }

            ImGui::SameLine();
            ImGui::DragInt("Key width", &params.keyPressWidth_samples, 8, 0, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Peak offset", &params.offsetFromPeak_samples, 8, -kSampleRate/10, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Align window", &params.alignWindow_samples, 8, 0, kSampleRate/10);

            ImGui::PopItemWidth();
        } else {
            if (g_doRecord) {
                g_doRecord = false;
                audioLogger.record(0.2f, 0);
            }

            if (ImGui::Button("   Stop Recording")) {
                audioLogger.pause();
                g_doRecord = false;

                stateUI.recalculateKeyPresses = true;
                stateUI.lastSize = stateUI.lastSize - 1;
                stateUI.recording = false;
                stateUI.findBestCutoffFreq = true;
                stateUI.rescaleWaveform = true;
            }
            {
                auto savePos = ImGui::GetCursorScreenPos();
                auto p0 = savePos;
                p0.x += 0.90f*ImGui::CalcTextSize("  ").x;
                p0.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();

                auto p1 = p0;
                p0.x -= 4.0f;
                p0.y -= 4.0f;
                p1.x += 4.0f;
                p1.y += 4.0f;

                ImGui::GetWindowDrawList()->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 1.0f, 1.0f }));
                ImGui::SetCursorScreenPos(savePos);
            }

            ImGui::SameLine();
            ImGui::Text("Record length: %4.2f s (max : %4.2f s)", (float)(stateUI.waveformInput.size())/kSampleRate, kMaxRecordSize_s);
        }

        if (recalculateKeyPresses) {
            findKeyPresses(getView(waveform, 0), keyPresses, waveformThreshold, waveformMax, thresholdBackground, kFindKeysHistorySize, historySizeReset, kFindKeysRemoveLowPower);
            recalculateKeyPresses = false;
        }

        stateUI.windowHeightKeyPesses = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightKeyPesses = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();

    return false;
}